

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseFunctionCall
          (ParserImpl *this,
          unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *caller)

{
  TokenDetail *pTVar1;
  undefined8 uVar2;
  void *pvVar3;
  MemberFuncCall *in_RDX;
  long in_RSI;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> args_1;
  int line_1;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> args;
  int line;
  TokenDetail member;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff18;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *puVar4;
  ParserImpl *in_stack_ffffffffffffff20;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *puVar5;
  int line_00;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff30;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff38;
  NormalFuncCall *in_stack_ffffffffffffff40;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff48;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_88;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_80 [2];
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> in_stack_ffffffffffffff98;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> in_stack_ffffffffffffffa0;
  ParserImpl *in_stack_ffffffffffffffb8;
  ParserImpl *this_00;
  
  pTVar1 = LookAhead(in_stack_ffffffffffffff20);
  if (pTVar1->token_ == 0x3a) {
    NextToken(in_stack_ffffffffffffff20);
    pTVar1 = NextToken(in_stack_ffffffffffffff20);
    if (pTVar1->token_ != 0x115) {
      uVar2 = __cxa_allocate_exception(0x20);
      luna::ParseException::ParseException
                ((ParseException *)in_stack_ffffffffffffffa0._M_head_impl,
                 (char *)in_stack_ffffffffffffff98._M_head_impl,
                 (TokenDetail *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
    }
    this_00 = *(ParserImpl **)(in_RSI + 8);
    LookAhead(in_stack_ffffffffffffff20);
    ParseArgs(this_00);
    pTVar1 = (TokenDetail *)operator_new(0x40);
    puVar4 = (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             &stack0xffffffffffffffa0;
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    puVar5 = (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             &stack0xffffffffffffff98;
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    luna::MemberFuncCall::MemberFuncCall
              (in_RDX,in_stack_ffffffffffffff48,pTVar1,puVar5,(int)((ulong)puVar4 >> 0x20));
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff20,(pointer)in_stack_ffffffffffffff18);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puVar4);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puVar4);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puVar4);
  }
  else {
    LookAhead(in_stack_ffffffffffffff20);
    ParseArgs(in_stack_ffffffffffffffb8);
    pvVar3 = operator_new(0x20);
    line_00 = (int)((ulong)pvVar3 >> 0x20);
    puVar4 = local_80;
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff20,puVar4);
    puVar5 = &local_88;
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              (puVar5,puVar4);
    luna::NormalFuncCall::NormalFuncCall
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,line_00
              );
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>(puVar5,(pointer)puVar4);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff30);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff30);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff30);
  }
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseFunctionCall(std::unique_ptr<SyntaxTree> caller)
        {
            if (LookAhead().token_ == ':')
            {
                NextToken();
                if (NextToken().token_ != Token_Id)
                    throw ParseException("expect 'id' after ':'", current_);

                TokenDetail member = current_;
                int line = LookAhead().line_;
                std::unique_ptr<SyntaxTree> args = ParseArgs();
                return std::unique_ptr<SyntaxTree>(new MemberFuncCall(std::move(caller), member,
                                                                      std::move(args), line));
            }
            else
            {
                int line = LookAhead().line_;
                std::unique_ptr<SyntaxTree> args = ParseArgs();
                return std::unique_ptr<SyntaxTree>(new NormalFuncCall(std::move(caller),
                                                                      std::move(args), line));
            }
        }